

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O1

void * OPENSSL_lh_retrieve_key
                 (_LHASH *lh,void *key,uint32_t key_hash,_func_int_void_ptr_void_ptr *cmp_key)

{
  LHASH_ITEM *pLVar1;
  int iVar2;
  void *pvVar3;
  LHASH_ITEM *pLVar4;
  lhash_item_st **pplVar5;
  
  pplVar5 = lh->buckets + (ulong)key_hash % lh->num_buckets;
  pLVar1 = *pplVar5;
  if (pLVar1 != (LHASH_ITEM *)0x0) {
    iVar2 = (*cmp_key)(key,pLVar1->data);
    if (iVar2 != 0) {
      do {
        pLVar4 = pLVar1;
        pLVar1 = pLVar4->next;
        if (pLVar1 == (lhash_item_st *)0x0) break;
        iVar2 = (*cmp_key)(key,pLVar1->data);
      } while (iVar2 != 0);
      pplVar5 = &pLVar4->next;
    }
  }
  if (*pplVar5 == (lhash_item_st *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = (*pplVar5)->data;
  }
  return pvVar3;
}

Assistant:

void *OPENSSL_lh_retrieve_key(const _LHASH *lh, const void *key,
                              uint32_t key_hash,
                              int (*cmp_key)(const void *key,
                                             const void *value)) {
  LHASH_ITEM **next_ptr = get_next_ptr_by_key(lh, key, key_hash, cmp_key);
  return *next_ptr == NULL ? NULL : (*next_ptr)->data;
}